

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O1

void __thiscall edition_unittest::TestPackedExtensions::Clear(TestPackedExtensions *this)

{
  google::protobuf::internal::ExtensionSet::Clear(&(this->field_0)._impl_._extensions_);
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestPackedExtensions::Clear() {
// @@protoc_insertion_point(message_clear_start:edition_unittest.TestPackedExtensions)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_._extensions_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}